

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O2

ReduceSumSquareLayerParams *
google::protobuf::internal::
down_cast<CoreML::Specification::ReduceSumSquareLayerParams_const*,google::protobuf::MessageLite_const>
          (MessageLite *f)

{
  long lVar1;
  
  if (f != (MessageLite *)0x0) {
    lVar1 = __dynamic_cast(f,&MessageLite::typeinfo,
                           &CoreML::Specification::ReduceSumSquareLayerParams::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("f == NULL || dynamic_cast<To>(f) != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/casts.h"
                    ,0x5b,
                    "To google::protobuf::internal::down_cast(From *) [To = const CoreML::Specification::ReduceSumSquareLayerParams *, From = const google::protobuf::MessageLite]"
                   );
    }
  }
  return (ReduceSumSquareLayerParams *)f;
}

Assistant:

inline To down_cast(From* f) {                   // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  if (false) {
    implicit_cast<From*, To>(0);
  }

#if !defined(NDEBUG) && !defined(GOOGLE_PROTOBUF_NO_RTTI)
  assert(f == NULL || dynamic_cast<To>(f) != NULL);  // RTTI: debug mode only!
#endif
  return static_cast<To>(f);
}